

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall IRBuilderAsmJs::CheckJitLoopReturn(IRBuilderAsmJs *this,RegSlot reg,IRType type)

{
  code *pcVar1;
  bool bVar2;
  Types type_00;
  uint32 typeReg;
  SymID SVar3;
  JitLoopBodyData *pJVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  
  bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (!bVar2) {
    return;
  }
  pJVar4 = GetJitLoopBodyData(this);
  if (pJVar4->m_yieldRegs == (BVFixed *)0x0) {
    if ((reg == 0) || (this->m_firstsType[5] <= reg)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x28a,"(RegIsConstant(reg))","RegIsConstant(reg)");
      if (!bVar2) goto LAB_004fc90c;
      *puVar5 = 0;
    }
  }
  else {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x273,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                         "m_func->GetJITFunctionBody()->IsWasmFunction()");
      if (!bVar2) goto LAB_004fc90c;
      *puVar5 = 0;
    }
    bVar2 = RegIsJitLoopYield(this,reg);
    if (bVar2) {
      return;
    }
    type_00 = WAsmJs::FromIRType(type);
    if (4 < (int)type_00) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x279,"(wasmType < WAsmJs::LIMIT)","wasmType < WAsmJs::LIMIT");
      if (!bVar2) goto LAB_004fc90c;
      *puVar5 = 0;
    }
    typeReg = GetTypedRegFromRegSlot(this,reg,type_00);
    pJVar4 = GetJitLoopBodyData(this);
    bVar2 = JitLoopBodyData::IsRegOutsideOfLoop(pJVar4,typeReg,type_00);
    if (!bVar2) {
      return;
    }
    if (((reg == 0) || (this->m_firstsType[5] <= reg)) &&
       ((reg < this->m_firstsType[10] ||
        ((SVar3 = GetMappedTemp(this,reg), SVar3 != reg &&
         (SVar3 = GetMappedTemp(this,reg), SVar3 != 0)))))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x27f,
                         "(RegIsConstant(reg) || (RegIsTemp(reg) && (GetMappedTemp(reg) == (SymID)reg || GetMappedTemp(reg) == 0)))"
                         ,
                         "RegIsConstant(reg) || (RegIsTemp(reg) && (GetMappedTemp(reg) == (SymID)reg || GetMappedTemp(reg) == 0))"
                        );
      if (!bVar2) {
LAB_004fc90c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pJVar4 = GetJitLoopBodyData(this);
    JitLoopBodyData::SetRegIsYield(pJVar4,reg);
  }
  EnsureLoopBodyAsmJsStoreSlot(this,reg,type);
  return;
}

Assistant:

void
IRBuilderAsmJs::CheckJitLoopReturn(Js::RegSlot reg, IRType type)
{
    if (IsLoopBody())
    {
#ifdef ENABLE_WASM
        if (GetJitLoopBodyData().IsLoopCurRegsInitialized())
        {
            Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
            // In Wasm we use the Return opcode for Yields
            // Check if that yield is outside of the loop (this also covers return)
            if (!RegIsJitLoopYield(reg))
            {
                WAsmJs::Types wasmType = WAsmJs::FromIRType(type);
                Assert(wasmType < WAsmJs::LIMIT);
                uint32 typedReg = GetTypedRegFromRegSlot(reg, wasmType);
                if (GetJitLoopBodyData().IsRegOutsideOfLoop(typedReg, wasmType))
                {
                    // The reg should be either a constant (return register)
                    // Or a temp, in which case, make sure we haven't mapped that temp to something else
                    Assert(RegIsConstant(reg) || (RegIsTemp(reg) && (GetMappedTemp(reg) == (SymID)reg || GetMappedTemp(reg) == 0)));
                    GetJitLoopBodyData().SetRegIsYield(reg);
                    EnsureLoopBodyAsmJsStoreSlot(reg, type);
                }
            }
        }
        else
#endif
        {
            // In Asm.js there is no Yields outside of the loop, if we're here
            // It means we are returning a value from the loop
            Assert(RegIsConstant(reg));
            EnsureLoopBodyAsmJsStoreSlot(reg, type);
        }
    }
}